

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraSat.c
# Opt level: O0

int Fra_NodesAreEquiv(Fra_Man_t *p,Aig_Obj_t *pOld,Aig_Obj_t *pNew)

{
  int iVar1;
  sat_solver *psVar2;
  abctime aVar3;
  abctime aVar4;
  double dVar5;
  int status;
  abctime clk;
  int nBTLimit;
  int RetValue1;
  int RetValue;
  int pLits [4];
  Aig_Obj_t *pNew_local;
  Aig_Obj_t *pOld_local;
  Fra_Man_t *p_local;
  
  pLits._8_8_ = pNew;
  iVar1 = Aig_IsComplement(pNew);
  if (iVar1 != 0) {
    __assert_fail("!Aig_IsComplement(pNew)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraSat.c"
                  ,0x37,"int Fra_NodesAreEquiv(Fra_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
  }
  iVar1 = Aig_IsComplement(pOld);
  if (iVar1 != 0) {
    __assert_fail("!Aig_IsComplement(pOld)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraSat.c"
                  ,0x38,"int Fra_NodesAreEquiv(Fra_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
  }
  if ((Aig_Obj_t *)pLits._8_8_ == pOld) {
    __assert_fail("pNew != pOld",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraSat.c"
                  ,0x39,"int Fra_NodesAreEquiv(Fra_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
  }
  clk._4_4_ = p->pPars->nBTLimitNode;
  if ((((p->pPars->fSpeculate == 0) && (p->pPars->nFramesK == 0)) && (0 < clk._4_4_)) &&
     (((*(ulong *)&pOld->field_0x18 >> 5 & 1) != 0 ||
      ((*(ulong *)(pLits._8_8_ + 0x18) >> 5 & 1) != 0)))) {
    p->nSatFails = p->nSatFails + 1;
    if (clk._4_4_ < 0xb) {
      return -1;
    }
    dVar5 = pow((double)clk._4_4_,0.7);
    clk._4_4_ = (int)dVar5;
  }
  p->nSatCalls = p->nSatCalls + 1;
  p->nSatCallsRecent = p->nSatCallsRecent + 1;
  if (p->pSat == (sat_solver *)0x0) {
    psVar2 = sat_solver_new();
    p->pSat = psVar2;
    p->nSatVars = 1;
    sat_solver_setnvars(p->pSat,1000);
    RetValue1 = toLit(0);
    sat_solver_addclause(p->pSat,&RetValue1,&RetValue);
  }
  Fra_CnfNodeAddToSolver(p,pOld,(Aig_Obj_t *)pLits._8_8_);
  if (p->pSat->qtail != p->pSat->qhead) {
    iVar1 = sat_solver_simplify(p->pSat);
    if (iVar1 == 0) {
      __assert_fail("status != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraSat.c"
                    ,0x5d,"int Fra_NodesAreEquiv(Fra_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
    }
    if (p->pSat->qtail != p->pSat->qhead) {
      __assert_fail("p->pSat->qtail == p->pSat->qhead",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraSat.c"
                    ,0x5e,"int Fra_NodesAreEquiv(Fra_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
    }
  }
  if (p->pPars->fConeBias != 0) {
    Fra_SetActivityFactors(p,pOld,(Aig_Obj_t *)pLits._8_8_);
  }
  aVar3 = Abc_Clock();
  iVar1 = Fra_ObjSatNum(pOld);
  RetValue1 = toLitCond(iVar1,0);
  iVar1 = Fra_ObjSatNum((Aig_Obj_t *)pLits._8_8_);
  RetValue = toLitCond(iVar1,(uint)(((uint)(*(ulong *)&pOld->field_0x18 >> 3) & 1) ==
                                   ((uint)(*(ulong *)(pLits._8_8_ + 0x18) >> 3) & 1)));
  iVar1 = sat_solver_solve(p->pSat,&RetValue1,pLits,(long)clk._4_4_,0,p->nBTLimitGlobal,
                           p->nInsLimitGlobal);
  aVar4 = Abc_Clock();
  p->timeSat = (aVar4 - aVar3) + p->timeSat;
  if (iVar1 == -1) {
    aVar4 = Abc_Clock();
    p->timeSatUnsat = (aVar4 - aVar3) + p->timeSatUnsat;
    RetValue1 = lit_neg(RetValue1);
    RetValue = lit_neg(RetValue);
    iVar1 = sat_solver_addclause(p->pSat,&RetValue1,pLits);
    if (iVar1 == 0) {
      __assert_fail("RetValue",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraSat.c"
                    ,0x75,"int Fra_NodesAreEquiv(Fra_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
    }
    p->nSatCallsUnsat = p->nSatCallsUnsat + 1;
    if (pOld == p->pManFraig->pConst1) {
      p->nSatProof = p->nSatProof + 1;
      p_local._4_4_ = 1;
    }
    else {
      aVar3 = Abc_Clock();
      iVar1 = Fra_ObjSatNum(pOld);
      RetValue1 = toLitCond(iVar1,1);
      iVar1 = Fra_ObjSatNum((Aig_Obj_t *)pLits._8_8_);
      RetValue = toLitCond(iVar1,(uint)(*(ulong *)&pOld->field_0x18 >> 3) & 1 ^
                                 (uint)(*(ulong *)(pLits._8_8_ + 0x18) >> 3) & 1);
      iVar1 = sat_solver_solve(p->pSat,&RetValue1,pLits,(long)clk._4_4_,0,p->nBTLimitGlobal,
                               p->nInsLimitGlobal);
      aVar4 = Abc_Clock();
      p->timeSat = (aVar4 - aVar3) + p->timeSat;
      if (iVar1 == -1) {
        aVar4 = Abc_Clock();
        p->timeSatUnsat = (aVar4 - aVar3) + p->timeSatUnsat;
        RetValue1 = lit_neg(RetValue1);
        RetValue = lit_neg(RetValue);
        iVar1 = sat_solver_addclause(p->pSat,&RetValue1,pLits);
        if (iVar1 == 0) {
          __assert_fail("RetValue",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraSat.c"
                        ,0xa1,"int Fra_NodesAreEquiv(Fra_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
        }
        p->nSatCallsUnsat = p->nSatCallsUnsat + 1;
        p->nSatProof = p->nSatProof + 1;
        p_local._4_4_ = 1;
      }
      else if (iVar1 == 1) {
        aVar4 = Abc_Clock();
        p->timeSatSat = (aVar4 - aVar3) + p->timeSatSat;
        Fra_SmlSavePattern(p);
        p->nSatCallsSat = p->nSatCallsSat + 1;
        p_local._4_4_ = 0;
      }
      else {
        aVar4 = Abc_Clock();
        p->timeSatFail = (aVar4 - aVar3) + p->timeSatFail;
        *(ulong *)&pOld->field_0x18 = *(ulong *)&pOld->field_0x18 & 0xffffffffffffffdf | 0x20;
        *(ulong *)(pLits._8_8_ + 0x18) = *(ulong *)(pLits._8_8_ + 0x18) & 0xffffffffffffffdf | 0x20;
        p->nSatFailsReal = p->nSatFailsReal + 1;
        p_local._4_4_ = -1;
      }
    }
  }
  else if (iVar1 == 1) {
    aVar4 = Abc_Clock();
    p->timeSatSat = (aVar4 - aVar3) + p->timeSatSat;
    Fra_SmlSavePattern(p);
    p->nSatCallsSat = p->nSatCallsSat + 1;
    p_local._4_4_ = 0;
  }
  else {
    aVar4 = Abc_Clock();
    p->timeSatFail = (aVar4 - aVar3) + p->timeSatFail;
    if (pOld != p->pManFraig->pConst1) {
      *(ulong *)&pOld->field_0x18 = *(ulong *)&pOld->field_0x18 & 0xffffffffffffffdf | 0x20;
    }
    *(ulong *)(pLits._8_8_ + 0x18) = *(ulong *)(pLits._8_8_ + 0x18) & 0xffffffffffffffdf | 0x20;
    p->nSatFailsReal = p->nSatFailsReal + 1;
    p_local._4_4_ = -1;
  }
  return p_local._4_4_;
}

Assistant:

int Fra_NodesAreEquiv( Fra_Man_t * p, Aig_Obj_t * pOld, Aig_Obj_t * pNew )
{
    int pLits[4], RetValue, RetValue1, nBTLimit;
    abctime clk;//, clk2 = Abc_Clock();
    int status;

    // make sure the nodes are not complemented
    assert( !Aig_IsComplement(pNew) );
    assert( !Aig_IsComplement(pOld) );
    assert( pNew != pOld );

    // if at least one of the nodes is a failed node, perform adjustments:
    // if the backtrack limit is small, simply skip this node
    // if the backtrack limit is > 10, take the quare root of the limit
    nBTLimit = p->pPars->nBTLimitNode;
    if ( !p->pPars->fSpeculate && p->pPars->nFramesK == 0 && (nBTLimit > 0 && (pOld->fMarkB || pNew->fMarkB)) )
    {
        p->nSatFails++;
        // fail immediately
//        return -1;
        if ( nBTLimit <= 10 )
            return -1;
        nBTLimit = (int)pow(nBTLimit, 0.7);
    }

    p->nSatCalls++;
    p->nSatCallsRecent++;

    // make sure the solver is allocated and has enough variables
    if ( p->pSat == NULL )
    {
        p->pSat = sat_solver_new();
        p->nSatVars = 1;
        sat_solver_setnvars( p->pSat, 1000 );
        // var 0 is reserved for const1 node - add the clause
        pLits[0] = toLit( 0 );
        sat_solver_addclause( p->pSat, pLits, pLits + 1 );
    }

    // if the nodes do not have SAT variables, allocate them
    Fra_CnfNodeAddToSolver( p, pOld, pNew );

    if ( p->pSat->qtail != p->pSat->qhead )
    {
        status = sat_solver_simplify(p->pSat);
        assert( status != 0 );
        assert( p->pSat->qtail == p->pSat->qhead );
    }

    // prepare variable activity
    if ( p->pPars->fConeBias )
        Fra_SetActivityFactors( p, pOld, pNew ); 

    // solve under assumptions
    // A = 1; B = 0     OR     A = 1; B = 1 
clk = Abc_Clock();
    pLits[0] = toLitCond( Fra_ObjSatNum(pOld), 0 );
    pLits[1] = toLitCond( Fra_ObjSatNum(pNew), pOld->fPhase == pNew->fPhase );
//Sat_SolverWriteDimacs( p->pSat, "temp.cnf", pLits, pLits + 2, 1 );
    RetValue1 = sat_solver_solve( p->pSat, pLits, pLits + 2, 
        (ABC_INT64_T)nBTLimit, (ABC_INT64_T)0, 
        p->nBTLimitGlobal, p->nInsLimitGlobal );
p->timeSat += Abc_Clock() - clk;
    if ( RetValue1 == l_False )
    {
p->timeSatUnsat += Abc_Clock() - clk;
        pLits[0] = lit_neg( pLits[0] );
        pLits[1] = lit_neg( pLits[1] );
        RetValue = sat_solver_addclause( p->pSat, pLits, pLits + 2 );
        assert( RetValue );
        // continue solving the other implication
        p->nSatCallsUnsat++;
    }
    else if ( RetValue1 == l_True )
    {
p->timeSatSat += Abc_Clock() - clk;
        Fra_SmlSavePattern( p );
        p->nSatCallsSat++;
        return 0;
    }
    else // if ( RetValue1 == l_Undef )
    {
p->timeSatFail += Abc_Clock() - clk;
        // mark the node as the failed node
        if ( pOld != p->pManFraig->pConst1 ) 
            pOld->fMarkB = 1;
        pNew->fMarkB = 1;
        p->nSatFailsReal++;
        return -1;
    }

    // if the old node was constant 0, we already know the answer
    if ( pOld == p->pManFraig->pConst1 )
    {
        p->nSatProof++;
        return 1;
    }

    // solve under assumptions
    // A = 0; B = 1     OR     A = 0; B = 0 
clk = Abc_Clock();
    pLits[0] = toLitCond( Fra_ObjSatNum(pOld), 1 );
    pLits[1] = toLitCond( Fra_ObjSatNum(pNew), pOld->fPhase ^ pNew->fPhase );
    RetValue1 = sat_solver_solve( p->pSat, pLits, pLits + 2, 
        (ABC_INT64_T)nBTLimit, (ABC_INT64_T)0, 
        p->nBTLimitGlobal, p->nInsLimitGlobal );
p->timeSat += Abc_Clock() - clk;
    if ( RetValue1 == l_False )
    {
p->timeSatUnsat += Abc_Clock() - clk;
        pLits[0] = lit_neg( pLits[0] );
        pLits[1] = lit_neg( pLits[1] );
        RetValue = sat_solver_addclause( p->pSat, pLits, pLits + 2 );
        assert( RetValue );
        p->nSatCallsUnsat++;
    }
    else if ( RetValue1 == l_True )
    {
p->timeSatSat += Abc_Clock() - clk;
        Fra_SmlSavePattern( p );
        p->nSatCallsSat++;
        return 0;
    }
    else // if ( RetValue1 == l_Undef )
    {
p->timeSatFail += Abc_Clock() - clk;
        // mark the node as the failed node
        pOld->fMarkB = 1;
        pNew->fMarkB = 1;
        p->nSatFailsReal++;
        return -1;
    }
/*
    // check BDD proof
    {
        int RetVal;
        ABC_PRT( "Sat", Abc_Clock() - clk2 );
        clk2 = Abc_Clock();
        RetVal = Fra_NodesAreEquivBdd( pOld, pNew );
//        printf( "%d ", RetVal );
        assert( RetVal );
        ABC_PRT( "Bdd", Abc_Clock() - clk2 );
        printf( "\n" );
    }
*/
    // return SAT proof
    p->nSatProof++;
    return 1;
}